

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlNodePtr xmlXPathNextDescendant(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlXPathContextPtr pxVar1;
  xmlNodePtr pxVar2;
  
  if ((ctxt != (xmlXPathParserContextPtr)0x0) &&
     (pxVar1 = ctxt->context, pxVar1 != (xmlXPathContextPtr)0x0)) {
    if (cur == (xmlNodePtr)0x0) {
      pxVar2 = pxVar1->node;
      if ((pxVar2 != (xmlNodePtr)0x0) && ((pxVar2->type | XML_ATTRIBUTE_DECL) != XML_NAMESPACE_DECL)
         ) {
        return pxVar2->children;
      }
    }
    else if (cur->type != XML_NAMESPACE_DECL) {
      pxVar2 = cur->children;
      if (((pxVar2 == (xmlNodePtr)0x0) || (pxVar2->type == XML_ENTITY_DECL)) ||
         (cur = pxVar2, pxVar2->type == XML_DTD_NODE)) {
        if (cur == pxVar1->node) {
          return (xmlNodePtr)0x0;
        }
        do {
          pxVar2 = cur->next;
          if (pxVar2 == (_xmlNode *)0x0) {
            while( true ) {
              cur = cur->parent;
              if (cur == (_xmlNode *)0x0) {
                return (xmlNodePtr)0x0;
              }
              if (cur == pxVar1->node) break;
              if (cur->next != (_xmlNode *)0x0) {
                return cur->next;
              }
            }
            return (xmlNodePtr)0x0;
          }
          cur = pxVar2;
        } while ((pxVar2->type == XML_ENTITY_DECL) || (pxVar2->type == XML_DTD_NODE));
      }
      return pxVar2;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextDescendant(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL) {
	if (ctxt->context->node == NULL)
	    return(NULL);
	if ((ctxt->context->node->type == XML_ATTRIBUTE_NODE) ||
	    (ctxt->context->node->type == XML_NAMESPACE_DECL))
	    return(NULL);

        if (ctxt->context->node == (xmlNodePtr) ctxt->context->doc)
	    return(ctxt->context->doc->children);
        return(ctxt->context->node->children);
    }

    if (cur->type == XML_NAMESPACE_DECL)
        return(NULL);
    if (cur->children != NULL) {
	/*
	 * Do not descend on entities declarations
	 */
	if (cur->children->type != XML_ENTITY_DECL) {
	    cur = cur->children;
	    /*
	     * Skip DTDs
	     */
	    if (cur->type != XML_DTD_NODE)
		return(cur);
	}
    }

    if (cur == ctxt->context->node) return(NULL);

    while (cur->next != NULL) {
	cur = cur->next;
	if ((cur->type != XML_ENTITY_DECL) &&
	    (cur->type != XML_DTD_NODE))
	    return(cur);
    }

    do {
        cur = cur->parent;
	if (cur == NULL) break;
	if (cur == ctxt->context->node) return(NULL);
	if (cur->next != NULL) {
	    cur = cur->next;
	    return(cur);
	}
    } while (cur != NULL);
    return(cur);
}